

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

jx9_value * jx9_new_array(jx9_vm *pVm)

{
  jx9_hashmap *pArray;
  jx9_value *pObj;
  jx9_hashmap *pMap;
  jx9_vm *pVm_local;
  
  if ((pVm == (jx9_vm *)0x0) || (pVm->nMagic == 0xdead2bad)) {
    pVm_local = (jx9_vm *)0x0;
  }
  else {
    pArray = jx9NewHashmap(pVm,(_func_sxu32_sxi64 *)0x0,(_func_sxu32_void_ptr_sxu32 *)0x0);
    if (pArray == (jx9_hashmap *)0x0) {
      pVm_local = (jx9_vm *)0x0;
    }
    else {
      pVm_local = (jx9_vm *)SyMemBackendPoolAlloc(&pVm->sAllocator,0x40);
      if (pVm_local == (jx9_vm *)0x0) {
        jx9HashmapRelease(pArray,1);
        pVm_local = (jx9_vm *)0x0;
      }
      else {
        jx9MemObjInitFromArray(pVm,(jx9_value *)pVm_local,pArray);
      }
    }
  }
  return (jx9_value *)pVm_local;
}

Assistant:

JX9_PRIVATE jx9_value * jx9_new_array(jx9_vm *pVm)
{
	jx9_hashmap *pMap;
	jx9_value *pObj;
	/* Ticket 1433-002: NULL VM is harmless operation */
	if ( JX9_VM_MISUSE(pVm) ){
		return 0;
	}
	/* Create a new hashmap first */
	pMap = jx9NewHashmap(&(*pVm), 0, 0);
	if( pMap == 0 ){
		return 0;
	}
	/* Associate a new jx9_value with this hashmap */
	pObj = (jx9_value *)SyMemBackendPoolAlloc(&pVm->sAllocator, sizeof(jx9_value));
	if( pObj == 0 ){
		jx9HashmapRelease(pMap, TRUE);
		return 0;
	}
	jx9MemObjInitFromArray(pVm, pObj, pMap);
	return pObj;
}